

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O3

void verb_prog_attach_weapon(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *pOVar1;
  
  pOVar1 = ch->carrying;
  while( true ) {
    if (pOVar1 == (OBJ_DATA *)0x0) {
      send_to_char("You don\'t have anything to attach it to!\n\r",ch);
      return;
    }
    if (pOVar1->pIndexData->vnum == 0x97f) break;
    pOVar1 = pOVar1->next_content;
  }
  act("You attach $p to a long wooden pole.",ch,obj,(void *)0x0,3);
  switch(obj->pIndexData->vnum) {
  case 0x980:
    obj_from_char(obj);
    obj_from_char(pOVar1);
    extract_obj(obj);
    extract_obj(pOVar1);
    break;
  case 0x981:
    obj_from_char(obj);
    obj_from_char(pOVar1);
    extract_obj(obj);
    extract_obj(pOVar1);
    break;
  case 0x982:
    obj_from_char(obj);
    obj_from_char(pOVar1);
    extract_obj(obj);
    extract_obj(pOVar1);
    break;
  case 0x983:
    obj_from_char(obj);
    obj_from_char(pOVar1);
    extract_obj(obj);
    extract_obj(pOVar1);
    break;
  default:
    return;
  }
  pObjIndex = get_obj_index(0);
  pOVar1 = create_object(pObjIndex,0x12);
  obj_to_char(pOVar1,ch);
  return;
}

Assistant:

void verb_prog_attach_weapon(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *pole, *finished;
	bool found= false;

	for (pole = ch->carrying; pole != nullptr; pole = pole->next_content)
	{
		if (pole->pIndexData->vnum == 2431)
		{
			found = true;
			break;
		}
	}

	if (!found)
	{
		send_to_char("You don't have anything to attach it to!\n\r", ch);
		return;
	}

	act("You attach $p to a long wooden pole.", ch, obj, 0, TO_CHAR);

	switch (obj->pIndexData->vnum)
	{
		case 2432:
			obj_from_char(obj);
			obj_from_char(pole);

			extract_obj(obj);
			extract_obj(pole);

			finished = create_object(get_obj_index(2461), 18);

			obj_to_char(finished, ch);
			break;
		case 2433:
			obj_from_char(obj);
			obj_from_char(pole);

			extract_obj(obj);
			extract_obj(pole);

			finished = create_object(get_obj_index(2462), 18);

			obj_to_char(finished, ch);
			break;
		case 2434:
			obj_from_char(obj);
			obj_from_char(pole);

			extract_obj(obj);
			extract_obj(pole);

			finished = create_object(get_obj_index(2463), 18);

			obj_to_char(finished, ch);
			break;
		case 2435:
			obj_from_char(obj);
			obj_from_char(pole);

			extract_obj(obj);
			extract_obj(pole);

			finished = create_object(get_obj_index(2464), 18);

			obj_to_char(finished, ch);
			break;
	}
}